

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout_p.h
# Opt level: O0

QRgba64 qRepremultiply<14u>(QRgba64 p)

{
  long lVar1;
  quint16 qVar2;
  uint uVar3;
  QRgba64 QVar4;
  quint64 in_RDI;
  long in_FS_OFFSET;
  uint mult;
  uint alpha;
  undefined4 in_stack_ffffffffffffffd8;
  QRgba64 local_18;
  QRgba64 *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.rgba = in_RDI;
  qVar2 = QRgba64::alpha(&local_18);
  uVar3 = (uint)qVar2;
  QVar4.rgba = local_18.rgba;
  if ((uVar3 != 0xffff) && (uVar3 != 0)) {
    local_18 = QRgba64::unpremultiplied((QRgba64 *)(ulong)CONCAT24(qVar2,in_stack_ffffffffffffffd8))
    ;
    QRgba64::setAlpha(&local_18,(short)(uVar3 >> 0xe) * 0x5555);
    QVar4 = QRgba64::premultiplied(in_stack_fffffffffffffff0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QRgba64)QVar4.rgba;
}

Assistant:

inline QRgba64 qRepremultiply(QRgba64 p)
{
    const uint alpha = p.alpha();
    if (alpha == 65535 || alpha == 0)
        return p;
    p = p.unpremultiplied();
    constexpr  uint mult = 65535 / (65535 >> Shift);
    p.setAlpha(mult * (alpha >> Shift));
    return p.premultiplied();
}